

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.h
# Opt level: O0

void __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::SplitBranchNode
          (SplitBranchNode *this,char16_t middleUnit,Node *lessThanNode,Node *greaterOrEqualNode)

{
  int32_t iVar1;
  int32_t iVar2;
  Node *greaterOrEqualNode_local;
  Node *lessThanNode_local;
  char16_t middleUnit_local;
  SplitBranchNode *this_local;
  
  iVar1 = Node::hashCode(lessThanNode);
  iVar2 = Node::hashCode(greaterOrEqualNode);
  BranchNode::BranchNode
            (&this->super_BranchNode,
             (((ushort)middleUnit + 0xc555549) * 0x25 + iVar1) * 0x25 + iVar2);
  (this->super_BranchNode).super_Node.super_UObject._vptr_UObject =
       (_func_int **)&PTR__SplitBranchNode_002bbc80;
  *(char16_t *)&(this->super_BranchNode).field_0x14 = middleUnit;
  this->lessThan = lessThanNode;
  this->greaterOrEqual = greaterOrEqualNode;
  return;
}

Assistant:

SplitBranchNode(char16_t middleUnit, Node *lessThanNode, Node *greaterOrEqualNode)
                : BranchNode(((0x555555u*37u+middleUnit)*37u+
                              hashCode(lessThanNode))*37u+hashCode(greaterOrEqualNode)),
                  unit(middleUnit), lessThan(lessThanNode), greaterOrEqual(greaterOrEqualNode) {}